

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidget::setHorizontalHeaderItem(QTableWidget *this,int column,QTableWidgetItem *item)

{
  QTableWidgetPrivate *this_00;
  QTableWidgetItem *pQVar1;
  long in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  QTableModel *unaff_retaddr;
  QTableWidgetPrivate *d;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 uVar2;
  int section;
  
  uVar2 = in_RDI;
  this_00 = d_func((QTableWidget *)0x8daa75);
  section = (int)((ulong)uVar2 >> 0x20);
  if (in_RDX == 0) {
    pQVar1 = takeHorizontalHeaderItem((QTableWidget *)this_00,(int)((ulong)in_RDI >> 0x20));
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      (*pQVar1->_vptr_QTableWidgetItem[1])();
    }
  }
  else {
    *(undefined8 *)(in_RDX + 0x28) = in_RDI;
    QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8daa9a);
    QTableModel::setHorizontalHeaderItem
              (unaff_retaddr,section,(QTableWidgetItem *)CONCAT44(in_ESI,in_stack_fffffffffffffff0))
    ;
  }
  return;
}

Assistant:

void QTableWidget::setHorizontalHeaderItem(int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        item->view = this;
        d->tableModel()->setHorizontalHeaderItem(column, item);
    } else {
        delete takeHorizontalHeaderItem(column);
    }
}